

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::Decode
          (SentencePieceProcessor *this,vector<int,_std::allocator<int>_> *ids,string *detokenized)

{
  bool bVar1;
  StatusBuilder *this_00;
  string *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  SentencePieceText spt;
  Status *_status;
  undefined4 in_stack_fffffffffffffd68;
  StatusCode in_stack_fffffffffffffd6c;
  StatusBuilder *in_stack_fffffffffffffd70;
  undefined1 local_218 [92];
  undefined4 local_1bc;
  uint local_38;
  byte local_21;
  string *local_20;
  undefined8 local_18;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  (**(code **)(*in_RSI + 0x38))
            (in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
  bVar1 = util::Status::ok((Status *)0x3df5b6);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    util::Status::~Status((Status *)0x3df61d);
  }
  if (local_38 == 0) {
    if (local_20 == (string *)0x0) {
      util::StatusBuilder::StatusBuilder(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
      this_00 = util::StatusBuilder::operator<<
                          (in_stack_fffffffffffffd70,
                           (char (*) [57])
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_1bc = 0x1a8;
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (int *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (char (*) [4])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (char (*) [3])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd70,
                 (char (*) [25])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      util::StatusBuilder::operator_cast_to_Status(this_00);
      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x3df72a);
    }
    else {
      std::__cxx11::string::clear();
      SentencePieceText::SentencePieceText((SentencePieceText *)0x3df76f);
      (**(code **)(*in_RSI + 0xf8))
                (in_RDI._M_t.
                 super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,
                 in_RSI,local_18,local_218);
      bVar1 = util::Status::ok((Status *)0x3df7a6);
      local_38 = (uint)!bVar1;
      if (bVar1) {
        util::Status::~Status((Status *)0x3df81d);
      }
      if (local_38 == 0) {
        in_stack_fffffffffffffd70 =
             (StatusBuilder *)
             SentencePieceText::mutable_text_abi_cxx11_((SentencePieceText *)0x3df83b);
        std::__cxx11::string::operator=(local_20,(string *)in_stack_fffffffffffffd70);
        util::OkStatus();
        local_38 = 1;
      }
      SentencePieceText::~SentencePieceText((SentencePieceText *)in_stack_fffffffffffffd70);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceProcessor::Decode(const std::vector<int> &ids,
                                            std::string *detokenized) const {
  CHECK_OR_RETURN_STATUS_STL(detokenized);

  SentencePieceText spt;
  RETURN_IF_ERROR(Decode(ids, &spt));
  *detokenized = std::move(*spt.mutable_text());

  return util::OkStatus();
}